

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void dtdReset(DTD *p,XML_Memory_Handling_Suite *ms)

{
  NAMED *pNVar1;
  ELEMENT_TYPE *e;
  HASH_TABLE_ITER iter;
  XML_Memory_Handling_Suite *ms_local;
  DTD *p_local;
  
  iter.end = (NAMED **)ms;
  hashTableIterInit((HASH_TABLE_ITER *)&e,&p->elementTypes);
  while (pNVar1 = hashTableIterNext((HASH_TABLE_ITER *)&e), pNVar1 != (NAMED *)0x0) {
    if (*(int *)((long)&pNVar1[3].name + 4) != 0) {
      (*(code *)iter.end[2])(pNVar1[4].name);
    }
  }
  hashTableClear(&p->generalEntities);
  hashTableClear(&p->elementTypes);
  hashTableClear(&p->attributeIds);
  hashTableClear(&p->prefixes);
  poolClear(&p->pool);
  poolClear(&p->entityValuePool);
  (p->defaultPrefix).name = (XML_Char *)0x0;
  (p->defaultPrefix).binding = (BINDING *)0x0;
  p->in_eldecl = '\0';
  (*(code *)iter.end[2])(p->scaffIndex);
  p->scaffIndex = (int *)0x0;
  (*(code *)iter.end[2])(p->scaffold);
  p->scaffold = (CONTENT_SCAFFOLD *)0x0;
  p->scaffLevel = 0;
  p->scaffSize = 0;
  p->scaffCount = 0;
  p->contentStringLen = 0;
  p->keepProcessing = '\x01';
  p->hasParamEntityRefs = '\0';
  p->standalone = '\0';
  return;
}

Assistant:

static void
dtdReset(DTD *p, const XML_Memory_Handling_Suite *ms) {
  HASH_TABLE_ITER iter;
  hashTableIterInit(&iter, &(p->elementTypes));
  for (;;) {
    ELEMENT_TYPE *e = (ELEMENT_TYPE *)hashTableIterNext(&iter);
    if (! e)
      break;
    if (e->allocDefaultAtts != 0)
      ms->free_fcn(e->defaultAtts);
  }
  hashTableClear(&(p->generalEntities));
#ifdef XML_DTD
  p->paramEntityRead = XML_FALSE;
  hashTableClear(&(p->paramEntities));
#endif /* XML_DTD */
  hashTableClear(&(p->elementTypes));
  hashTableClear(&(p->attributeIds));
  hashTableClear(&(p->prefixes));
  poolClear(&(p->pool));
  poolClear(&(p->entityValuePool));
  p->defaultPrefix.name = NULL;
  p->defaultPrefix.binding = NULL;

  p->in_eldecl = XML_FALSE;

  ms->free_fcn(p->scaffIndex);
  p->scaffIndex = NULL;
  ms->free_fcn(p->scaffold);
  p->scaffold = NULL;

  p->scaffLevel = 0;
  p->scaffSize = 0;
  p->scaffCount = 0;
  p->contentStringLen = 0;

  p->keepProcessing = XML_TRUE;
  p->hasParamEntityRefs = XML_FALSE;
  p->standalone = XML_FALSE;
}